

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_estimateCCtxSize(int compressionLevel)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  int compressionLevel_00;
  size_t largestSize;
  ulong uVar4;
  undefined1 in_stack_00000090 [28];
  ZSTD_compressionParameters local_50;
  
  compressionLevel_00 = 1;
  if (compressionLevel < 1) {
    compressionLevel_00 = compressionLevel;
  }
  uVar4 = 0;
  for (; compressionLevel_00 <= compressionLevel; compressionLevel_00 = compressionLevel_00 + 1) {
    sVar2 = 0;
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
      ZSTD_getCParams_internal
                (&local_50,compressionLevel_00,
                 *(unsigned_long_long *)((long)&ZSTD_estimateCCtxSize_internal_srcSizeTiers + lVar3)
                 ,0,ZSTD_cpm_noAttachDict);
      sVar1 = ZSTD_estimateCCtxSize_usingCParams((ZSTD_compressionParameters)in_stack_00000090);
      if (sVar2 < sVar1) {
        sVar2 = ZSTD_estimateCCtxSize_usingCParams((ZSTD_compressionParameters)in_stack_00000090);
      }
    }
    if (uVar4 < sVar2) {
      uVar4 = sVar2;
    }
  }
  return uVar4;
}

Assistant:

size_t ZSTD_estimateCCtxSize(int compressionLevel)
{
    int level;
    size_t memBudget = 0;
    for (level=MIN(compressionLevel, 1); level<=compressionLevel; level++) {
        /* Ensure monotonically increasing memory usage as compression level increases */
        size_t const newMB = ZSTD_estimateCCtxSize_internal(level);
        if (newMB > memBudget) memBudget = newMB;
    }
    return memBudget;
}